

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

ggml_gallocr_t ggml_gallocr_new_n(ggml_backend_buffer_type_t *bufts,int n_bufs)

{
  ggml_gallocr_t pgVar1;
  ggml_backend_buffer_type_t *ppgVar2;
  ggml_backend_buffer_t *ppgVar3;
  ggml_dyn_tallocr **ppgVar4;
  ggml_dyn_tallocr *pgVar5;
  int in_ESI;
  long in_RDI;
  size_t alignment;
  int j;
  int i;
  ggml_gallocr_t galloc;
  size_t in_stack_00001000;
  int local_20;
  int local_1c;
  
  pgVar1 = (ggml_gallocr_t)calloc(1,0x60);
  if (pgVar1 == (ggml_gallocr_t)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
               ,0x17e,"GGML_ASSERT(%s) failed","galloc != NULL");
  }
  ppgVar2 = (ggml_backend_buffer_type_t *)calloc((long)in_ESI,8);
  pgVar1->bufts = ppgVar2;
  if (pgVar1->bufts == (ggml_backend_buffer_type_t *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
               ,0x181,"GGML_ASSERT(%s) failed","galloc->bufts != NULL");
  }
  ppgVar3 = (ggml_backend_buffer_t *)calloc((long)in_ESI,8);
  pgVar1->buffers = ppgVar3;
  if (pgVar1->buffers == (ggml_backend_buffer_t *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
               ,0x184,"GGML_ASSERT(%s) failed","galloc->buffers != NULL");
  }
  ppgVar4 = (ggml_dyn_tallocr **)calloc((long)in_ESI,8);
  pgVar1->buf_tallocs = ppgVar4;
  if (pgVar1->buf_tallocs == (ggml_dyn_tallocr **)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
               ,0x187,"GGML_ASSERT(%s) failed","galloc->buf_tallocs != NULL");
  }
  local_1c = 0;
  do {
    if (in_ESI <= local_1c) {
      pgVar1->n_buffers = in_ESI;
      return pgVar1;
    }
    pgVar1->bufts[local_1c] = *(ggml_backend_buffer_type_t *)(in_RDI + (long)local_1c * 8);
    pgVar1->buffers[local_1c] = (ggml_backend_buffer_t)0x0;
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      if (*(long *)(in_RDI + (long)local_1c * 8) == *(long *)(in_RDI + (long)local_20 * 8)) {
        pgVar1->buf_tallocs[local_1c] = pgVar1->buf_tallocs[local_20];
        break;
      }
    }
    if (pgVar1->buf_tallocs[local_1c] == (ggml_dyn_tallocr *)0x0) {
      ggml_backend_buft_get_alignment((ggml_backend_buffer_type_t)0x15afe8);
      pgVar5 = ggml_dyn_tallocr_new(in_stack_00001000);
      pgVar1->buf_tallocs[local_1c] = pgVar5;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

ggml_gallocr_t ggml_gallocr_new_n(ggml_backend_buffer_type_t * bufts, int n_bufs) {
    ggml_gallocr_t galloc = (ggml_gallocr_t)calloc(1, sizeof(struct ggml_gallocr));
    GGML_ASSERT(galloc != NULL);

    galloc->bufts = calloc(n_bufs, sizeof(ggml_backend_buffer_type_t));
    GGML_ASSERT(galloc->bufts != NULL);

    galloc->buffers = calloc(n_bufs, sizeof(ggml_backend_buffer_t));
    GGML_ASSERT(galloc->buffers != NULL);

    galloc->buf_tallocs = calloc(n_bufs, sizeof(struct ggml_dyn_tallocr *));
    GGML_ASSERT(galloc->buf_tallocs != NULL);

    for (int i = 0; i < n_bufs; i++) {
        galloc->bufts[i] = bufts[i];
        galloc->buffers[i] = NULL;

        // check if the same buffer type is used multiple times and reuse the same allocator
        for (int j = 0; j < i; j++) {
            if (bufts[i] == bufts[j]) {
                galloc->buf_tallocs[i] = galloc->buf_tallocs[j];
                break;
            }
        }

        if (galloc->buf_tallocs[i] == NULL) {
            size_t alignment = ggml_backend_buft_get_alignment(bufts[i]);
            galloc->buf_tallocs[i] = ggml_dyn_tallocr_new(alignment);
        }
    }
    galloc->n_buffers = n_bufs;

    return galloc;
}